

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::TrimCapabilitiesPass::HasForbiddenCapabilities(TrimCapabilitiesPass *this)

{
  IRContext *this_00;
  bool bVar1;
  FeatureManager *pFVar2;
  
  if ((this->forbiddenCapabilities_).size_ != 0) {
    this_00 = (this->super_Pass).context_;
    pFVar2 = (this_00->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    if (pFVar2 == (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(this_00);
      pFVar2 = (this_00->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    }
    bVar1 = EnumSet<spv::Capability>::HasAnyOf(&pFVar2->capabilities_,&this->forbiddenCapabilities_)
    ;
    return bVar1;
  }
  return false;
}

Assistant:

bool TrimCapabilitiesPass::HasForbiddenCapabilities() const {
  // EnumSet.HasAnyOf returns `true` if the given set is empty.
  if (forbiddenCapabilities_.size() == 0) {
    return false;
  }

  const auto& capabilities = context()->get_feature_mgr()->GetCapabilities();
  return capabilities.HasAnyOf(forbiddenCapabilities_);
}